

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaveinfo.c
# Opt level: O2

int si_PDOassign(uint16 slave,uint16 PDOassign,int mapoffset,int bitoffset)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined6 in_register_00000032;
  undefined6 in_register_0000003a;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint8 subcnt;
  ushort local_66;
  int rdl;
  ushort local_5e;
  uint local_5c;
  uint local_58;
  int local_54;
  uint local_50;
  uint local_4c;
  int local_48;
  uint local_44;
  uint local_40;
  int local_3c;
  ulong local_38;
  
  rdl = 2;
  local_66 = 0;
  iVar7 = 0;
  local_48 = mapoffset;
  iVar2 = ec_SDOread(CONCAT62(in_register_0000003a,slave),CONCAT62(in_register_00000032,PDOassign),0
                     ,0,&rdl,&local_66,700000);
  local_5e = local_66;
  if (local_66 != 0 && 0 < iVar2) {
    uVar8 = CONCAT62((int6)((ulong)&local_66 >> 0x10),1);
    local_4c = (uint)PDOassign;
    iVar7 = 0;
    local_58 = (uint)slave;
    while( true ) {
      uVar3 = local_58;
      uVar4 = (uint)uVar8;
      if (local_5e < (ushort)uVar8) break;
      rdl = 2;
      local_66 = 0;
      ec_SDOread(local_58,local_4c,uVar8 & 0xff,0,&rdl,&local_66,700000);
      if (local_66 != 0) {
        rdl = 1;
        subcnt = '\0';
        uVar5 = 0;
        local_44 = (uint)local_66;
        ec_SDOread(uVar3,local_66,0,0,&rdl,&subcnt,700000);
        local_40 = (uint)subcnt;
        local_5c = uVar4;
        while( true ) {
          uVar3 = local_58;
          uVar4 = (uint)uVar8;
          if ((short)local_40 == (short)uVar5) break;
          rdl = 4;
          local_50 = 0;
          bVar1 = false;
          local_54 = iVar7;
          local_38 = uVar5;
          ec_SDOread(local_58,local_44,(int)uVar5 + 1U & 0xff,0,&rdl,&local_50,700000);
          uVar4 = local_50;
          uVar6 = local_50 >> 0x10;
          ODlist.Slave = (uint16)uVar3;
          ODlist.Index[0] = (uint16)(local_50 >> 0x10);
          OElist.Entries = 0;
          uVar3 = local_50 >> 8 & 0xff;
          local_3c = bitoffset;
          if (0xffff < local_50 || uVar3 != 0) {
            iVar2 = ec_readOEsingle(0,local_50 >> 8 & 0xff,&ODlist,&OElist);
            bVar1 = 0 < iVar2;
          }
          uVar4 = uVar4 & 0xff;
          printf("  [0x%4.4X.%1d] 0x%4.4X:0x%2.2X 0x%2.2X",(ulong)(uint)(bitoffset / 8 + local_48),
                 (long)bitoffset % 8 & 0xffffffff,(ulong)uVar6,(ulong)uVar3,(ulong)uVar4);
          if ((bVar1) && (OElist.Entries != 0)) {
            dtype2string(OElist.DataType[uVar3]);
            printf(" %-12s %s\n",hstr,(ulong)uVar3 * 0x29 + 0x112896);
          }
          else {
            putchar(10);
          }
          uVar8 = (ulong)local_5c;
          iVar7 = local_54 + uVar4;
          bitoffset = local_3c + uVar4;
          uVar5 = (ulong)((int)local_38 + 1);
        }
      }
      uVar8 = (ulong)(uVar4 + 1);
    }
  }
  return iVar7;
}

Assistant:

int si_PDOassign(uint16 slave, uint16 PDOassign, int mapoffset, int bitoffset)
{
    uint16 idxloop, nidx, subidxloop, rdat, idx, subidx;
    uint8 subcnt;
    int wkc, bsize = 0, rdl;
    int32 rdat2;
    uint8 bitlen, obj_subidx;
    uint16 obj_idx;
    int abs_offset, abs_bit;

    rdl = sizeof(rdat); rdat = 0;
    /* read PDO assign subindex 0 ( = number of PDO's) */
    wkc = ec_SDOread(slave, PDOassign, 0x00, FALSE, &rdl, &rdat, EC_TIMEOUTRXM);
    rdat = etohs(rdat);
    /* positive result from slave ? */
    if ((wkc > 0) && (rdat > 0))
    {
        /* number of available sub indexes */
        nidx = rdat;
        bsize = 0;
        /* read all PDO's */
        for (idxloop = 1; idxloop <= nidx; idxloop++)
        {
            rdl = sizeof(rdat); rdat = 0;
            /* read PDO assign */
            wkc = ec_SDOread(slave, PDOassign, (uint8)idxloop, FALSE, &rdl, &rdat, EC_TIMEOUTRXM);
            /* result is index of PDO */
            idx = etohl(rdat);
            if (idx > 0)
            {
                rdl = sizeof(subcnt); subcnt = 0;
                /* read number of subindexes of PDO */
                wkc = ec_SDOread(slave,idx, 0x00, FALSE, &rdl, &subcnt, EC_TIMEOUTRXM);
                subidx = subcnt;
                /* for each subindex */
                for (subidxloop = 1; subidxloop <= subidx; subidxloop++)
                {
                    rdl = sizeof(rdat2); rdat2 = 0;
                    /* read SDO that is mapped in PDO */
                    wkc = ec_SDOread(slave, idx, (uint8)subidxloop, FALSE, &rdl, &rdat2, EC_TIMEOUTRXM);
                    rdat2 = etohl(rdat2);
                    /* extract bitlength of SDO */
                    bitlen = LO_BYTE(rdat2);
                    bsize += bitlen;
                    obj_idx = (uint16)(rdat2 >> 16);
                    obj_subidx = (uint8)((rdat2 >> 8) & 0x000000ff);
                    abs_offset = mapoffset + (bitoffset / 8);
                    abs_bit = bitoffset % 8;
                    ODlist.Slave = slave;
                    ODlist.Index[0] = obj_idx;
                    OElist.Entries = 0;
                    wkc = 0;
                    /* read object entry from dictionary if not a filler (0x0000:0x00) */
                    if(obj_idx || obj_subidx)
                        wkc = ec_readOEsingle(0, obj_subidx, &ODlist, &OElist);
                    printf("  [0x%4.4X.%1d] 0x%4.4X:0x%2.2X 0x%2.2X", abs_offset, abs_bit, obj_idx, obj_subidx, bitlen);
                    if((wkc > 0) && OElist.Entries)
                    {
                        printf(" %-12s %s\n", dtype2string(OElist.DataType[obj_subidx]), OElist.Name[obj_subidx]);
                    }
                    else
                        printf("\n");
                    bitoffset += bitlen;
                };
            };
        };
    };
    /* return total found bitlength (PDO) */
    return bsize;
}